

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarketDataRequest.h
# Opt level: O0

void __thiscall FIX50::MarketDataRequest::NoMDEntryTypes::NoMDEntryTypes(NoMDEntryTypes *this)

{
  message_order local_30 [32];
  NoMDEntryTypes *local_10;
  NoMDEntryTypes *this_local;
  
  local_10 = this;
  FIX::message_order::message_order(local_30,0x10d,0);
  FIX::Group::Group(&this->super_Group,0x10b,0x10d,local_30);
  FIX::message_order::~message_order(local_30);
  *(undefined ***)&this->super_Group = &PTR__NoMDEntryTypes_0018a7a8;
  return;
}

Assistant:

NoMDEntryTypes() : FIX::Group(267,269,FIX::message_order(269,0)) {}